

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nan_handling.hpp
# Opt level: O2

void wdm::utils::remove_incomplete
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,vector<double,_std::allocator<double>_> *w
               )

{
  size_type __new_size;
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  double dVar7;
  
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = ((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) + -1;
  pdVar2 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar6 = 0;
  do {
    __new_size = lVar5 + 1;
    if (__new_size <= uVar6) {
      std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
      std::vector<double,_std::allocator<double>_>::resize(y,__new_size);
      if ((w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_finish ==
          (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_start) {
        return;
      }
      std::vector<double,_std::allocator<double>_>::resize(w,__new_size);
      return;
    }
    dVar7 = pdVar1[uVar6];
    if (NAN(dVar7)) {
      if (pdVar4 != pdVar3) {
LAB_00104534:
        dVar7 = pdVar3[uVar6];
        goto LAB_0010453a;
      }
LAB_00104550:
      pdVar1[uVar6] = pdVar1[lVar5];
      pdVar1[lVar5] = dVar7;
      dVar7 = pdVar2[uVar6];
      pdVar2[uVar6] = pdVar2[lVar5];
      uVar6 = uVar6 - 1;
      pdVar2[lVar5] = dVar7;
      lVar5 = lVar5 + -1;
    }
    else {
      if (pdVar4 != pdVar3) {
        if (NAN(pdVar2[uVar6])) goto LAB_00104534;
        dVar7 = pdVar3[uVar6];
        if (!NAN(dVar7)) goto LAB_0010452a;
LAB_0010453a:
        pdVar3[uVar6] = pdVar3[lVar5];
        pdVar3[lVar5] = dVar7;
        dVar7 = pdVar1[uVar6];
        goto LAB_00104550;
      }
      if (NAN(pdVar2[uVar6])) goto LAB_00104550;
    }
LAB_0010452a:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

inline void remove_incomplete(std::vector<double>& x,
                              std::vector<double>& y,
                              std::vector<double>& w)
{
    // if observation conatins nan, move it to the end
    size_t last = x.size() - 1;
    for (size_t i = 0; i < last + 1; i++) {
        bool row_has_nan = (std::isnan(x[i]) || std::isnan(y[i]));
        if (w.size() > 0)
            row_has_nan = (row_has_nan || std::isnan(w[i]));
        if (row_has_nan) {
            if (w.size() > 0)
                std::swap(w[i], w[last]);
            std::swap(x[i], x[last]);
            std::swap(y[i--], y[last--]);
        }
    }

    x.resize(last + 1);
    y.resize(last + 1);
    if (w.size() > 0)
        w.resize(last + 1);
}